

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O0

uint32_t __thiscall cab::passengers_at_node(cab *this,node_type node)

{
  road_network *prVar1;
  bool bVar2;
  node_type nVar3;
  node_type q;
  node_type nVar4;
  uint32_t uVar5;
  reference prVar6;
  undefined1 local_40 [8];
  request r;
  iterator __end1;
  iterator __begin1;
  vector<request,_std::allocator<request>_> *__range1;
  uint32_t passengers;
  node_type node_local;
  cab *this_local;
  
  __range1._0_4_ = 0;
  __end1 = std::vector<request,_std::allocator<request>_>::begin(&this->_requests);
  r._8_8_ = std::vector<request,_std::allocator<request>_>::end(&this->_requests);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<request_*,_std::vector<request,_std::allocator<request>_>_>
                                *)&r._detours);
    if (!bVar2) {
      return (uint32_t)__range1;
    }
    prVar6 = __gnu_cxx::
             __normal_iterator<request_*,_std::vector<request,_std::allocator<request>_>_>::
             operator*(&__end1);
    local_40[0] = prVar6->_src;
    local_40[1] = prVar6->_dst;
    local_40._2_2_ = *(undefined2 *)&prVar6->field_0x2;
    local_40._4_4_ = prVar6->_passengers;
    r._0_8_ = *(undefined8 *)&prVar6->_detours;
    prVar1 = this->_rnet;
    nVar4 = this->_position;
    nVar3 = request::dst((request *)local_40);
    q = request::src((request *)local_40);
    bVar2 = road_network::in_between(prVar1,nVar4,nVar3,q);
    if (bVar2) {
      prVar1 = this->_rnet;
      nVar4 = request::src((request *)local_40);
      nVar3 = request::dst((request *)local_40);
      bVar2 = road_network::in_between(prVar1,nVar4,nVar3,node);
      if (!bVar2) goto LAB_00145aad;
      uVar5 = request::passengers((request *)local_40);
      __range1._0_4_ = uVar5 + (uint32_t)__range1;
    }
    else {
LAB_00145aad:
      prVar1 = this->_rnet;
      nVar4 = request::src((request *)local_40);
      nVar3 = request::dst((request *)local_40);
      bVar2 = road_network::in_between(prVar1,nVar4,nVar3,this->_position);
      if ((bVar2) && (bVar2 = request::picked_up((request *)local_40), bVar2)) {
        prVar1 = this->_rnet;
        nVar4 = this->_position;
        nVar3 = request::dst((request *)local_40);
        bVar2 = road_network::in_between(prVar1,nVar4,nVar3,node);
        if (bVar2) {
          uVar5 = request::passengers((request *)local_40);
          __range1._0_4_ = uVar5 + (uint32_t)__range1;
        }
      }
    }
    nVar4 = request::dst((request *)local_40);
    if (nVar4 == node) {
      uVar5 = request::passengers((request *)local_40);
      __range1._0_4_ = (uint32_t)__range1 - uVar5;
    }
    __gnu_cxx::__normal_iterator<request_*,_std::vector<request,_std::allocator<request>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

std::uint32_t cab::passengers_at_node(node_type node)
{
    std::uint32_t passengers = 0;
    for(auto r : _requests)
    {
        // add to passengers either if r.src() -> node -> r.dst() and _position -> r.src() -> r.dst()
        // or r.src() -> _position -> r.dst() and cab has picked up passengers at position and _position -> node -> r.dst()
        if(_rnet->in_between(_position, r.dst(), r.src()) &&
                _rnet->in_between(r.src(), r.dst(), node))
        {
            passengers += r.passengers();
        }
        else if(_rnet->in_between(r.src(), r.dst(), _position) && r.picked_up() && _rnet->in_between(_position, r.dst(), node))
        { 
            passengers += r.passengers();
        }

        // if r.dst() == node it still gets counted above
        if(r.dst() == node)
        {
            passengers -= r.passengers();
        }
    }
    
    return passengers;
}